

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  size_t len;
  ulong uVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  
  iVar3 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar8 = buf->off;
    (puVar1 + sVar8)[0] = '\0';
    (puVar1 + sVar8)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  iVar6 = 6;
  if (iVar3 != 0) goto LAB_00127670;
  sVar8 = buf->off;
  iVar3 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar3 == 0) {
    buf->base[buf->off] = '\0';
    buf->off = buf->off + 1;
    iVar3 = 0;
  }
  if (iVar3 != 0) goto LAB_00127670;
  iVar3 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar7 = buf->off;
    (puVar1 + sVar7)[0] = '\0';
    (puVar1 + sVar7)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  iVar6 = 6;
  if (iVar3 == 0) {
    sVar7 = buf->off;
    len = strlen(server_name);
    iVar3 = ptls_buffer__do_pushv(buf,server_name,len);
    if (iVar3 != 0) goto LAB_0012762c;
    uVar4 = buf->off - sVar7;
    if (0xffff < uVar4) {
      iVar3 = 0x20c;
      goto LAB_0012762c;
    }
    lVar5 = 8;
    do {
      buf->base[sVar7 - 2] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
      lVar5 = lVar5 + -8;
      sVar7 = sVar7 + 1;
    } while (lVar5 != -8);
    bVar2 = true;
    iVar3 = 0;
    iVar6 = 0;
  }
  else {
LAB_0012762c:
    bVar2 = false;
  }
  if (bVar2) {
    uVar4 = buf->off - sVar8;
    if (uVar4 < 0x10000) {
      lVar5 = 8;
      do {
        buf->base[sVar8 - 2] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
        lVar5 = lVar5 + -8;
        sVar8 = sVar8 + 1;
      } while (lVar5 != -8);
      iVar6 = 0;
    }
    else {
      iVar6 = 6;
      iVar3 = 0x20c;
    }
  }
LAB_00127670:
  if (iVar6 == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}